

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::LDForceModifier::LDForceModifier(LDForceModifier *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  pointer *pppHVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Velocitizer *pVVar4;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  HydroProp *this_00;
  pointer pcVar7;
  iterator iVar8;
  Molecule *pMVar9;
  bool bVar10;
  int iVar11;
  Velocitizer *this_01;
  Molecule *pMVar12;
  Ellipsoid *this_02;
  undefined1 *puVar13;
  Globals *pGVar14;
  undefined4 extraout_var;
  HydroIO *this_03;
  iterator iVar15;
  pointer ppSVar16;
  long lVar17;
  uint i_1;
  long lVar18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
  *ppVar19;
  long lVar20;
  Mat3x3d *pMVar21;
  MomentData *pMVar22;
  byte bVar23;
  RealType RVar24;
  RealType RVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined8 uVar29;
  HydroProp *currHydroProp;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  MoleculeIterator i;
  SquareMatrix<double,_3> m;
  LennardJonesAdapter lja;
  GayBerneAdapter local_1a0;
  undefined1 local_198 [32];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
  *local_178;
  MoleculeIterator local_170;
  vector<OpenMD::HydroProp*,std::allocator<OpenMD::HydroProp*>> *local_168;
  vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>> *local_160;
  undefined1 local_158 [8];
  undefined1 auStack_150 [8];
  undefined1 local_148 [24];
  double local_130;
  double local_128;
  double dStack_120;
  double local_118;
  _Base_ptr local_110;
  LennardJonesAdapter local_108;
  double local_100;
  RealType local_f8;
  Molecule *local_f0;
  int local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  Mat3x3d local_78;
  long lVar28;
  
  bVar23 = 0;
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__LDForceModifier_002f4ce0;
  local_110 = &(this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_110;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_110;
  p_Var1 = &(this->momentsMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->hydroProps_).super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hydroProps_).super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hydroProps_).super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->moments_).super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->moments_).super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->moments_).super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->maxIterNum_ = 6;
  this->forceTolerance_ = 1e-06;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_178 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
               *)&this->hydroPropMap_;
  local_168 = (vector<OpenMD::HydroProp*,std::allocator<OpenMD::HydroProp*>> *)&this->hydroProps_;
  local_160 = (vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>> *)&this->moments_;
  (this->forceDistribution_)._M_param._M_mean = 0.0;
  (this->forceDistribution_)._M_param._M_stddev = 1.0;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  pGVar14 = info->simParams_;
  this->simParams_ = pGVar14;
  (this->veloMunge_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)0x0;
  local_100 = (pGVar14->Dt).data_;
  this->dt2_ = local_100 * 0.5;
  this_01 = (Velocitizer *)operator_new(0x30);
  Velocitizer::Velocitizer(this_01,(this->super_ForceModifier).info_);
  pVVar4 = (this->veloMunge_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  (this->veloMunge_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = this_01;
  if (pVVar4 != (Velocitizer *)0x0) {
    (*pVVar4->_vptr_Velocitizer[1])();
  }
  this->sphericalBoundaryConditions_ = false;
  pGVar14 = this->simParams_;
  if ((pGVar14->UseSphericalBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
    this->sphericalBoundaryConditions_ = true;
    if ((pGVar14->LangevinBufferRadius).super_ParameterBase.empty_ == false) {
      this->langevinBufferRadius_ = (pGVar14->LangevinBufferRadius).data_;
    }
    else {
      memcpy(&painCave,
             "langevinBufferRadius must be specified when useSphericalBoundaryConditions is turned on.\n"
             ,0x5a);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      pGVar14 = this->simParams_;
    }
    if ((pGVar14->FrozenBufferRadius).super_ParameterBase.empty_ == false) {
      dVar26 = (pGVar14->FrozenBufferRadius).data_;
      this->frozenBufferRadius_ = dVar26;
    }
    else {
      memcpy(&painCave,
             "frozenBufferRadius must be specified when useSphericalBoundaryConditions is turned on.\n"
             ,0x58);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      dVar26 = this->frozenBufferRadius_;
    }
    if (dVar26 < this->langevinBufferRadius_) {
      memcpy(&painCave,
             "frozenBufferRadius has been set smaller than the langevinBufferRadius.  This is probably an error.\n"
             ,100);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
    }
  }
  local_170._M_node = (_Base_ptr)0x0;
  pMVar12 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_170);
  bVar10 = false;
  while (pMVar12 != (Molecule *)0x0) {
    ppSVar16 = (pMVar12->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (pMVar12->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar16 != ppSVar5) {
      pSVar6 = *ppSVar16;
      while (pSVar6 != (StuntDouble *)0x0) {
        ppSVar16 = ppSVar16 + 1;
        if (pSVar6->objType_ == otRigidBody) {
          bVar10 = (bool)(bVar10 | 8U < (ulong)((long)pSVar6[2].properties_._vptr_PropertyMap -
                                               (long)pSVar6[2].mass_));
        }
        if (ppSVar16 == ppSVar5) break;
        pSVar6 = *ppSVar16;
      }
    }
    pMVar12 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_170);
  }
  if (bVar10) {
    if ((this->simParams_->HydroPropFile).super_ParameterBase.empty_ == false) {
      this_03 = (HydroIO *)operator_new(0xc0);
      HydroIO::HydroIO(this_03);
      pcVar7 = (this->simParams_->HydroPropFile).data_._M_dataplus._M_p;
      local_198._0_8_ = (MomentData *)(local_198 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,pcVar7,
                 pcVar7 + (this->simParams_->HydroPropFile).data_._M_string_length);
      HydroIO::parseHydroFile
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                  *)local_158,this_03,(string *)local_198);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
               *)local_178);
      if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)0x0) {
        (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             auStack_150._0_4_;
        (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_148._0_8_;
        (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)local_148._8_8_;
        (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)local_148._16_8_;
        *(_Base_ptr *)(local_148._0_8_ + 8) = local_110;
        (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_130;
        local_148._0_8_ = (_Base_ptr)0x0;
        local_130 = 0.0;
        local_148._8_8_ = (HydroProp *)auStack_150;
        local_148._16_8_ = (HydroProp *)auStack_150;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   *)local_158);
      if ((MomentData *)local_198._0_8_ != (MomentData *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_,CONCAT71(local_198._17_7_,local_198[0x10]) + 1);
      }
    }
    else {
      memcpy(&painCave,
             "HydroPropFile must be set to a file name if Langevin Dynamics\n\tis specified for rigidBodies which contain more than one atom\n\tTo create a HydroPropFile, run the \"Hydro\" program.\n"
             ,0xb3);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    pMVar12 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_170);
    while (pMVar12 != (Molecule *)0x0) {
      ppSVar16 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar16 !=
          (pMVar12->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = *ppSVar16;
        while (pSVar6 != (StuntDouble *)0x0) {
          ppSVar16 = ppSVar16 + 1;
          (*pSVar6->_vptr_StuntDouble[7])((key_type *)local_158,pSVar6);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                           *)local_178,(key_type *)local_158);
          if (local_158 != (undefined1  [8])local_148) {
            operator_delete((void *)local_158,(ulong)(local_148._0_8_ + 1));
          }
          if (iVar15._M_node == local_110) {
            (*pSVar6->_vptr_StuntDouble[7])((key_type *)local_158,pSVar6);
            snprintf(painCave.errMsg,2000,"Can not find resistance tensor for atom [%s]\n",local_158
                    );
            if (local_158 != (undefined1  [8])local_148) {
              operator_delete((void *)local_158,(ulong)(local_148._0_8_ + 1));
            }
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
          }
          else {
            iVar8._M_current =
                 (this->hydroProps_).
                 super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->hydroProps_).
                super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<OpenMD::HydroProp*,std::allocator<OpenMD::HydroProp*>>::
              _M_realloc_insert<OpenMD::HydroProp*const&>
                        (local_168,iVar8,(HydroProp **)(iVar15._M_node + 2));
            }
            else {
              *iVar8._M_current = *(HydroProp **)(iVar15._M_node + 2);
              pppHVar2 = &(this->hydroProps_).
                          super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppHVar2 = *pppHVar2 + 1;
            }
            local_158 = (undefined1  [8])getMomentData(this,pSVar6);
            std::vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>>::
            emplace_back<OpenMD::MomentData*>(local_160,(MomentData **)local_158);
          }
          if (ppSVar16 ==
              (pMVar12->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          pSVar6 = *ppSVar16;
        }
      }
      pMVar12 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_170);
    }
  }
  else {
    pMVar12 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_170);
    local_e8 = -0x80000000;
    uStack_e4 = 0x80000000;
    uStack_e0 = 0x80000000;
    uStack_dc = 0x80000000;
    while (pMVar12 != (Molecule *)0x0) {
      ppSVar16 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar9 = local_f0;
      if (ppSVar16 !=
          (pMVar12->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = *ppSVar16;
        while (local_f0 = pMVar12, pSVar6 != (StuntDouble *)0x0) {
          if (pSVar6->objType_ < otRigidBody) {
            this_00 = (HydroProp *)pSVar6[1]._vptr_StuntDouble;
            local_1a0.at_ = (AtomType *)this_00;
            bVar10 = GayBerneAdapter::isGayBerne(&local_1a0);
            if (bVar10) {
              this_02 = (Ellipsoid *)operator_new(0xa8);
              local_98.super_Vector<double,_3U>.data_[2] = _DAT_002fce88;
              local_98.super_Vector<double,_3U>.data_[0] = OpenMD::V3Zero;
              local_98.super_Vector<double,_3U>.data_[1] = DAT_002fce80;
              local_f8 = GayBerneAdapter::getL(&local_1a0);
              local_f8 = local_f8 * 0.5;
              RVar24 = GayBerneAdapter::getD(&local_1a0);
              iVar11 = local_e8;
              RVar25 = local_f8;
              local_128 = 0.0;
              dStack_120 = 0.0;
              local_148._16_8_ = (HydroProp *)0x0;
              local_130 = 0.0;
              local_148._0_8_ = (_Base_ptr)0x0;
              local_148._8_8_ = (HydroProp *)0x0;
              local_158 = (undefined1  [8])0x0;
              auStack_150 = (undefined1  [8])0x0;
              local_118 = 0.0;
              puVar13 = auStack_150;
              lVar17 = 0;
              lVar18 = 0;
              do {
                lVar20 = 0;
                auVar27 = _DAT_00285320;
                do {
                  bVar10 = SUB164(auVar27 ^ _DAT_00285330,4) == iVar11 &&
                           SUB164(auVar27 ^ _DAT_00285330,0) < -0x7ffffffd;
                  if (bVar10) {
                    uVar29 = 0x3ff0000000000000;
                    if (lVar17 != lVar20) {
                      uVar29 = 0;
                    }
                    *(undefined8 *)(puVar13 + lVar20 + -8) = uVar29;
                  }
                  if (bVar10) {
                    uVar29 = 0x3ff0000000000000;
                    if (lVar17 + -8 != lVar20) {
                      uVar29 = 0;
                    }
                    *(undefined8 *)(puVar13 + lVar20) = uVar29;
                  }
                  lVar28 = auVar27._8_8_;
                  auVar27._0_8_ = auVar27._0_8_ + 2;
                  auVar27._8_8_ = lVar28 + 2;
                  lVar20 = lVar20 + 0x10;
                } while (lVar20 != 0x20);
                lVar18 = lVar18 + 1;
                lVar17 = lVar17 + 8;
                puVar13 = puVar13 + 0x18;
              } while (lVar18 != 3);
              ppVar19 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                         *)local_158;
              pMVar21 = &local_78;
              for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pMVar21->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [0] = (double)(ppVar19->first)._M_dataplus._M_p;
                ppVar19 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                           *)((long)ppVar19 + (ulong)bVar23 * -0x10 + 8);
                pMVar21 = (Mat3x3d *)((long)pMVar21 + ((ulong)bVar23 * -2 + 1) * 8);
              }
              Ellipsoid::Ellipsoid(this_02,&local_98,RVar25,RVar24 * 0.5,&local_78);
            }
            else {
              local_108.at_ = (AtomType *)this_00;
              bVar10 = LennardJonesAdapter::isLennardJones(&local_108);
              if (bVar10) {
                this_02 = (Ellipsoid *)operator_new(0x48);
                local_b8.super_Vector<double,_3U>.data_[2] = _DAT_002fce88;
                local_b8.super_Vector<double,_3U>.data_[0] = OpenMD::V3Zero;
                local_b8.super_Vector<double,_3U>.data_[1] = DAT_002fce80;
                RVar25 = LennardJonesAdapter::getSigma(&local_108);
                Sphere::Sphere((Sphere *)this_02,&local_b8,RVar25 * 0.5);
              }
              else {
                AtomType::allYourBase
                          ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                           local_198,(AtomType *)this_00);
                for (pMVar22 = (MomentData *)local_198._0_8_;
                    pMVar22 != (MomentData *)local_198._8_8_;
                    pMVar22 = (MomentData *)((pMVar22->rcr).super_Vector<double,_3U>.data_ + 1)) {
                  AtomType::getName_abi_cxx11_
                            ((string *)local_158,
                             (AtomType *)(pMVar22->rcr).super_Vector<double,_3U>.data_[0]);
                  iVar11 = ElementsTable::GetAtomicNum((ElementsTable *)etab,(char *)local_158);
                  if (local_158 != (undefined1  [8])local_148) {
                    operator_delete((void *)local_158,(ulong)(local_148._0_8_ + 1));
                  }
                  if (iVar11 != 0) {
                    this_02 = (Ellipsoid *)operator_new(0x48);
                    local_d8.super_Vector<double,_3U>.data_[2] = _DAT_002fce88;
                    local_d8.super_Vector<double,_3U>.data_[0] = OpenMD::V3Zero;
                    local_d8.super_Vector<double,_3U>.data_[1] = DAT_002fce80;
                    RVar25 = ElementsTable::GetVdwRad((ElementsTable *)etab,iVar11);
                    Sphere::Sphere((Sphere *)this_02,&local_d8,RVar25);
                    goto LAB_001cee37;
                  }
                }
                builtin_strncpy(painCave.errMsg + 0x20,"ult element.txt\n",0x11);
                builtin_strncpy(painCave.errMsg + 0x10,"tom type in defa",0x10);
                builtin_strncpy(painCave.errMsg,"Could not find a",0x10);
                painCave.isFatal = 1;
                painCave.severity = 1;
                simError();
                this_02 = (Ellipsoid *)0x0;
LAB_001cee37:
                if ((MomentData *)local_198._0_8_ != (MomentData *)0x0) {
                  operator_delete((void *)local_198._0_8_,
                                  CONCAT71(local_198._17_7_,local_198[0x10]) - local_198._0_8_);
                }
              }
            }
          }
          else {
            this_02 = (Ellipsoid *)0x0;
          }
          pGVar14 = this->simParams_;
          if ((pGVar14->TargetTemp).super_ParameterBase.empty_ == true) {
            builtin_strncpy(painCave.errMsg,
                            "You can\'t use LangevinDynamics without a targetTemp!\n",0x36);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
            pGVar14 = this->simParams_;
          }
          if ((pGVar14->Viscosity).super_ParameterBase.empty_ == true) {
            builtin_strncpy(painCave.errMsg,"You can\'t use LangevinDynamics without a viscosity!\n"
                            ,0x35);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
            pGVar14 = this->simParams_;
          }
          iVar11 = (*(this_02->super_Shape)._vptr_Shape[5])((pGVar14->Viscosity).data_,this_02);
          local_1a0.at_ = (AtomType *)CONCAT44(extraout_var,iVar11);
          (*pSVar6->_vptr_StuntDouble[7])
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                      *)local_158,pSVar6);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                           *)local_178,(key_type *)local_158);
          if (local_158 != (undefined1  [8])local_148) {
            operator_delete((void *)local_158,(ulong)(local_148._0_8_ + 1));
          }
          if (iVar15._M_node == local_110) {
            HydroProp::complete((HydroProp *)local_1a0.at_);
            (*pSVar6->_vptr_StuntDouble[7])(local_198,pSVar6);
            if ((MomentData *)local_198._0_8_ == (MomentData *)(local_198 + 0x10)) {
              local_148._8_8_ = local_198._24_8_;
              local_158 = (undefined1  [8])local_148;
            }
            else {
              local_158 = (undefined1  [8])local_198._0_8_;
            }
            local_148._1_7_ = local_198._17_7_;
            local_148[0] = local_198[0x10];
            auStack_150 = (undefined1  [8])local_198._8_8_;
            local_198._8_8_ = (MomentData *)0x0;
            local_198[0x10] = '\0';
            local_148._16_8_ = local_1a0.at_;
            local_198._0_8_ = (MomentData *)(local_198 + 0x10);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>
                      (local_178,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                        *)local_158);
            if (local_158 != (undefined1  [8])local_148) {
              operator_delete((void *)local_158,(ulong)(local_148._0_8_ + 1));
            }
            if ((MomentData *)local_198._0_8_ != (MomentData *)(local_198 + 0x10)) {
              operator_delete((void *)local_198._0_8_,CONCAT71(local_198._17_7_,local_198[0x10]) + 1
                             );
            }
            iVar8._M_current =
                 (this->hydroProps_).
                 super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->hydroProps_).
                super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<OpenMD::HydroProp*,std::allocator<OpenMD::HydroProp*>>::
              _M_realloc_insert<OpenMD::HydroProp*const&>(local_168,iVar8,(HydroProp **)&local_1a0);
            }
            else {
              *iVar8._M_current = (HydroProp *)local_1a0.at_;
              pppHVar2 = &(this->hydroProps_).
                          super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppHVar2 = *pppHVar2 + 1;
            }
            local_158 = (undefined1  [8])getMomentData(this,pSVar6);
            std::vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>>::
            emplace_back<OpenMD::MomentData*>(local_160,(MomentData **)local_158);
          }
          else {
            iVar8._M_current =
                 (this->hydroProps_).
                 super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->hydroProps_).
                super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<OpenMD::HydroProp*,std::allocator<OpenMD::HydroProp*>>::
              _M_realloc_insert<OpenMD::HydroProp*const&>
                        (local_168,iVar8,(HydroProp **)(iVar15._M_node + 2));
            }
            else {
              *iVar8._M_current = *(HydroProp **)(iVar15._M_node + 2);
              pppHVar2 = &(this->hydroProps_).
                          super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppHVar2 = *pppHVar2 + 1;
            }
            local_158 = (undefined1  [8])getMomentData(this,pSVar6);
            std::vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>>::
            emplace_back<OpenMD::MomentData*>(local_160,(MomentData **)local_158);
          }
          (*(this_02->super_Shape)._vptr_Shape[1])(this_02);
          ppSVar16 = ppSVar16 + 1;
          pMVar9 = local_f0;
          if (ppSVar16 ==
              (local_f0->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          pMVar12 = local_f0;
          pSVar6 = *ppSVar16;
        }
      }
      local_f0 = pMVar9;
      pMVar12 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_170);
    }
  }
  dVar26 = ((this->simParams_->TargetTemp).data_ * 0.0039744312) / local_100;
  if (dVar26 < 0.0) {
    dVar26 = sqrt(dVar26);
  }
  else {
    dVar26 = SQRT(dVar26);
  }
  (this->forceDistribution_)._M_param._M_mean = 0.0;
  (this->forceDistribution_)._M_param._M_stddev = dVar26;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  return;
}

Assistant:

LDForceModifier::LDForceModifier(SimInfo* info) :
      ForceModifier {info}, maxIterNum_ {6}, forceTolerance_ {1e-6},
      randNumGen_ {info->getRandomNumberGenerator()},
      simParams_ {info->getSimParams()} {
    RealType dt = simParams_->getDt();
    dt2_        = dt * 0.5;

    veloMunge_ = std::make_unique<Velocitizer>(info_);

    sphericalBoundaryConditions_ = false;
    if (simParams_->getUseSphericalBoundaryConditions()) {
      sphericalBoundaryConditions_ = true;
      if (simParams_->haveLangevinBufferRadius()) {
        langevinBufferRadius_ = simParams_->getLangevinBufferRadius();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "langevinBufferRadius must be specified "
                 "when useSphericalBoundaryConditions is turned on.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      if (simParams_->haveFrozenBufferRadius()) {
        frozenBufferRadius_ = simParams_->getFrozenBufferRadius();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "frozenBufferRadius must be specified "
                 "when useSphericalBoundaryConditions is turned on.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      if (frozenBufferRadius_ < langevinBufferRadius_) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "frozenBufferRadius has been set smaller than the "
                 "langevinBufferRadius.  This is probably an error.\n");
        painCave.severity = OPENMD_WARNING;
        painCave.isFatal  = 0;
        simError();
      }
    }

    // Build the hydroProp_ map:
    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    bool needHydroPropFile = false;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (sd->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(sd);
          if (rb->getNumAtoms() > 1) needHydroPropFile = true;
        }
      }
    }

    if (needHydroPropFile) {
      if (simParams_->haveHydroPropFile()) {
        HydroIO* hio  = new HydroIO();
        hydroPropMap_ = hio->parseHydroFile(simParams_->getHydroPropFile());
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "HydroPropFile must be set to a file name if Langevin Dynamics\n"
            "\tis specified for rigidBodies which contain more than one atom\n"
            "\tTo create a HydroPropFile, run the \"Hydro\" program.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          map<string, HydroProp*>::iterator iter =
              hydroPropMap_.find(sd->getType());
          if (iter != hydroPropMap_.end()) {
            hydroProps_.push_back(iter->second);
            moments_.push_back(getMomentData(sd));

          } else {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not find resistance tensor for atom [%s]\n",
                     sd->getType().c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        }
      }

    } else {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          Shape* currShape = NULL;

          if (sd->isAtom()) {
            Atom* atom          = static_cast<Atom*>(sd);
            AtomType* atomType  = atom->getAtomType();
            GayBerneAdapter gba = GayBerneAdapter(atomType);
            if (gba.isGayBerne()) {
              currShape = new Ellipsoid(V3Zero, gba.getL() / 2.0,
                                        gba.getD() / 2.0, Mat3x3d::identity());
            } else {
              LennardJonesAdapter lja = LennardJonesAdapter(atomType);
              if (lja.isLennardJones()) {
                currShape = new Sphere(V3Zero, lja.getSigma() / 2.0);
              } else {
                int aNum(0);
                vector<AtomType*> atChain = atomType->allYourBase();
                vector<AtomType*>::iterator i;
                for (i = atChain.begin(); i != atChain.end(); ++i) {
                  aNum = etab.GetAtomicNum((*i)->getName().c_str());
                  if (aNum != 0) {
                    currShape = new Sphere(V3Zero, etab.GetVdwRad(aNum));
                    break;
                  }
                }
                if (aNum == 0) {
                  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                           "Could not find atom type in default element.txt\n");
                  painCave.severity = OPENMD_ERROR;
                  painCave.isFatal  = 1;
                  simError();
                }
              }
            }
          }

          if (!simParams_->haveTargetTemp()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "You can't use LangevinDynamics without a targetTemp!\n");
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
            simError();
          }

          if (!simParams_->haveViscosity()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "You can't use LangevinDynamics without a viscosity!\n");
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
            simError();
          }

          HydroProp* currHydroProp =
              currShape->getHydroProp(simParams_->getViscosity());
          map<string, HydroProp*>::iterator iter =
              hydroPropMap_.find(sd->getType());
          if (iter != hydroPropMap_.end()) {
            hydroProps_.push_back(iter->second);
            moments_.push_back(getMomentData(sd));

          } else {
            currHydroProp->complete();
            hydroPropMap_.insert(map<string, HydroProp*>::value_type(
                sd->getType(), currHydroProp));
            hydroProps_.push_back(currHydroProp);
            moments_.push_back(getMomentData(sd));
          }
          delete currShape;
        }
      }
    }

    RealType stdDev =
        std::sqrt(2.0 * Constants::kb * simParams_->getTargetTemp() / dt);

    forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
  }